

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O0

bool __thiscall
xray_re::xr_object::save_object(xr_object *this,char *path,compress_options compress)

{
  bool bVar1;
  uint8_t *data;
  size_t size;
  undefined1 local_4120 [7];
  bool status;
  xr_memory_writer file;
  undefined1 local_2098 [8];
  xr_memory_writer w;
  compress_options compress_local;
  char *path_local;
  xr_object *this_local;
  
  w.m_pos._4_4_ = compress;
  xr_memory_writer::xr_memory_writer((xr_memory_writer *)local_2098);
  (*(this->super_xr_surface_factory)._vptr_xr_surface_factory[0xb])
            (this,(xr_memory_writer *)local_2098);
  xr_memory_writer::xr_memory_writer((xr_memory_writer *)local_4120);
  data = xr_memory_writer::data((xr_memory_writer *)local_2098);
  size = xr_memory_writer::tell((xr_memory_writer *)local_2098);
  xr_writer::w_raw_chunk((xr_writer *)local_4120,0x7777,data,size,w.m_pos._4_4_ != none);
  bVar1 = xr_memory_writer::save_to((xr_memory_writer *)local_4120,path);
  xr_memory_writer::~xr_memory_writer((xr_memory_writer *)local_4120);
  xr_memory_writer::~xr_memory_writer((xr_memory_writer *)local_2098);
  return bVar1;
}

Assistant:

bool xr_object::save_object(const char* path, compress_options compress) const
{
	xr_memory_writer w;
	save_object(w);

	xr_memory_writer file;
	file.w_raw_chunk(EOBJ_CHUNK_MAIN, w.data(), w.tell(), compress != compress_options::none);

	bool status = file.save_to(path);
	return status;
}